

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# openjtalk.c
# Opt level: O3

size_t Open_JTalk_get_sampling_frequency(Open_JTalk *open_jtalk,_Bool *error)

{
  size_t sVar1;
  
  if (error == (_Bool *)0x0) {
    if (open_jtalk != (Open_JTalk *)0x0) goto LAB_00145952;
  }
  else {
    *error = false;
    if (open_jtalk != (Open_JTalk *)0x0) {
LAB_00145952:
      sVar1 = HTS_Engine_get_sampling_frequency(&open_jtalk->engine);
      return sVar1;
    }
    *error = true;
  }
  return 0;
}

Assistant:

size_t Open_JTalk_get_sampling_frequency(Open_JTalk *open_jtalk, bool *error)
{
	if (error)
	{
		*error = false;
	}

	if (open_jtalk == NULL)
	{
		if (error)
		{
			*error = true;
		}
		return 0;
	}
	return HTS_Engine_get_sampling_frequency(&open_jtalk->engine);
}